

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void search(player *p)

{
  bool bVar1;
  wchar_t wVar2;
  _Bool _Var3;
  object *obj;
  loc grid;
  wchar_t wVar4;
  
  if ((((p->timed[2] == 0) && (_Var3 = no_light(p), !_Var3)) && (p->timed[4] == 0)) &&
     (p->timed[6] == 0)) {
    wVar2 = (p->grid).y + L'\xffffffff';
    do {
      wVar4 = (p->grid).x + L'\xffffffff';
      do {
        grid.y = wVar2;
        grid.x = wVar4;
        _Var3 = square_issecretdoor(cave,grid);
        if (_Var3) {
          msg("You have found a secret door.");
          place_closed_door(cave,(loc_conflict)grid);
          disturb(p);
        }
        for (obj = square_object(cave,grid); obj != (object *)0x0; obj = obj->next) {
          if (((obj->known != (object *)0x0) && (_Var3 = ignore_item_ok(p,obj), !_Var3)) &&
             ((_Var3 = is_trapped_chest(obj), _Var3 && (obj->known->pval != obj->pval)))) {
            msg("You have discovered a trap on the chest!");
            obj->known->pval = obj->pval;
            disturb(p);
          }
        }
        bVar1 = wVar4 <= (p->grid).x;
        wVar4 = wVar4 + L'\x01';
      } while (bVar1);
      bVar1 = wVar2 <= (p->grid).y;
      wVar2 = wVar2 + L'\x01';
    } while (bVar1);
  }
  return;
}

Assistant:

void search(struct player *p)
{
	struct loc grid;

	/* Various conditions mean no searching */
	if (p->timed[TMD_BLIND] || no_light(p) ||
		p->timed[TMD_CONFUSED] || p->timed[TMD_IMAGE])
		return;

	/* Search the nearby grids, which are always in bounds */
	for (grid.y = (p->grid.y - 1); grid.y <= (p->grid.y + 1); grid.y++) {
		for (grid.x = (p->grid.x - 1); grid.x <= (p->grid.x + 1); grid.x++) {
			struct object *obj;

			/* Secret doors */
			if (square_issecretdoor(cave, grid)) {
				msg("You have found a secret door.");
				place_closed_door(cave, grid);
				disturb(p);
			}

			/* Traps on chests */
			for (obj = square_object(cave, grid); obj; obj = obj->next) {
				if (!obj->known || ignore_item_ok(p, obj)
						|| !is_trapped_chest(obj)) {
					continue;
				}

				if (obj->known->pval != obj->pval) {
					msg("You have discovered a trap on the chest!");
					obj->known->pval = obj->pval;
					disturb(p);
				}
			}
		}
	}
}